

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::togglelockspec_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  clientinfo *ci_00;
  char *pcVar4;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    ci._4_4_ = atoi(args[1]);
    if ((ci._4_4_ < 0) || (1000 < ci._4_4_)) {
      bVar1 = true;
      goto LAB_0018e2f6;
    }
  }
  else {
    ci._4_4_ = QServ::getSender(&qs);
  }
  ci_00 = QServ::getClient(&qs,ci._4_4_);
  if (ci_00 == (clientinfo *)0x0) {
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,"\f3Error: Player not connected");
  }
  else if (((((ci_00->connected & 1U) != 0) && (iVar3 = QServ::getSender(&qs), ci._4_4_ != iVar3))
           && (-1 < ci._4_4_)) &&
          (((ci._4_4_ < 0x3e9 && (ci_00 != (clientinfo *)0x0)) &&
           (((ci_00->connected & 1U) != 0 && (args[1] != (char *)0x0)))))) {
    if ((ci_00->isSpecLocked & 1U) == 0) {
      forcespectator(ci_00);
      ci_00->isSpecLocked = true;
      sendf(ci_00->clientnum,1,"ris",0x23,"\f3You have been locked in spectator mode.");
    }
    else if ((ci_00->isSpecLocked & 1U) != 0) {
      unspectate(ci_00);
      ci_00->isSpecLocked = false;
      sendf(ci_00->clientnum,1,"ris",0x23,"\f3You are no longer locked in spectator mode.");
    }
  }
LAB_0018e2f6:
  if (bVar1) {
    iVar3 = QServ::getSender(&qs);
    pcVar4 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar3,1,"ris",0x23,pcVar4);
  }
  return;
}

Assistant:

QSERV_CALLBACK togglelockspec_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    lockspecprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                        
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(!ci->isSpecLocked) {
                                    forcespectator(ci);
                                    ci->isSpecLocked = true;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You have been locked in spectator mode.");
                            } else if(ci->isSpecLocked) {
                                    unspectate(ci);
                                    ci->isSpecLocked = false;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You are no longer locked in spectator mode.");
                        }
            
                    }
                           
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto lockspecprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }